

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__sort_edges_ins_sort(stbtt__edge *p,int n)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  stbtt__edge *psVar7;
  stbtt__edge *psVar8;
  int c;
  stbtt__edge *b;
  stbtt__edge *a;
  stbtt__edge t;
  int j;
  int i;
  int n_local;
  stbtt__edge *p_local;
  
  for (t.invert = 1; t.invert < n; t.invert = t.invert + 1) {
    psVar7 = p + t.invert;
    uVar2 = psVar7->x0;
    uVar3 = psVar7->y0;
    fVar5 = psVar7->x1;
    fVar6 = psVar7->y1;
    iVar1 = psVar7->invert;
    t.y1 = (float)t.invert;
    while ((0 < (int)t.y1 && ((float)uVar3 < p[(int)t.y1 + -1].y0))) {
      psVar8 = p + ((int)t.y1 + -1);
      psVar7 = p + (int)t.y1;
      fVar4 = psVar8->y0;
      psVar7->x0 = psVar8->x0;
      psVar7->y0 = fVar4;
      fVar4 = psVar8->y1;
      psVar7->x1 = psVar8->x1;
      psVar7->y1 = fVar4;
      psVar7->invert = psVar8->invert;
      t.y1 = (float)((int)t.y1 + -1);
    }
    if ((float)t.invert != t.y1) {
      psVar7 = p + (int)t.y1;
      psVar7->x0 = (float)uVar2;
      psVar7->y0 = (float)uVar3;
      psVar7->x1 = fVar5;
      psVar7->y1 = fVar6;
      psVar7->invert = iVar1;
    }
  }
  return;
}

Assistant:

static void stbtt__sort_edges_ins_sort(stbtt__edge *p, int n)
{
   int i,j;
   for (i=1; i < n; ++i) {
      stbtt__edge t = p[i], *a = &t;
      j = i;
      while (j > 0) {
         stbtt__edge *b = &p[j-1];
         int c = STBTT__COMPARE(a,b);
         if (!c) break;
         p[j] = p[j-1];
         --j;
      }
      if (i != j)
         p[j] = t;
   }
}